

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.h
# Opt level: O3

void __thiscall adios2::profiling::Timer::AddToJsonStr(Timer *this,string *rankLog,bool addComma)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  uint uVar3;
  char cVar4;
  long *plVar5;
  undefined8 *puVar6;
  ulong *puVar7;
  ulong uVar8;
  ulong uVar9;
  undefined8 *puVar10;
  char cVar11;
  undefined8 *puVar12;
  undefined8 uVar13;
  ulong uVar14;
  uint __len;
  string __str_1;
  string __str;
  undefined8 *local_b0;
  undefined8 local_a0;
  undefined8 uStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (this->m_nCalls == 0) {
    return;
  }
  if (addComma) {
    std::__cxx11::string::append((char *)rankLog);
  }
  std::operator+(&local_50,"\"",&this->m_Process);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  puVar7 = (ulong *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar7) {
    local_90.field_2._M_allocated_capacity = *puVar7;
    local_90.field_2._8_8_ = plVar5[3];
  }
  else {
    local_90.field_2._M_allocated_capacity = *puVar7;
    local_90._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_90._M_string_length = plVar5[1];
  *plVar5 = (long)puVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  uVar14 = this->m_ProcessTime;
  uVar9 = -uVar14;
  if (0 < (long)uVar14) {
    uVar9 = uVar14;
  }
  __len = 1;
  if (9 < uVar9) {
    uVar8 = uVar9;
    uVar3 = 4;
    do {
      __len = uVar3;
      if (uVar8 < 100) {
        __len = __len - 2;
        goto LAB_00622312;
      }
      if (uVar8 < 1000) {
        __len = __len - 1;
        goto LAB_00622312;
      }
      if (uVar8 < 10000) goto LAB_00622312;
      bVar2 = 99999 < uVar8;
      uVar8 = uVar8 / 10000;
      uVar3 = __len + 4;
    } while (bVar2);
    __len = __len + 1;
  }
LAB_00622312:
  local_70 = local_60;
  std::__cxx11::string::_M_construct((ulong)&local_70,(char)__len - (char)((long)uVar14 >> 0x3f));
  std::__detail::__to_chars_10_impl<unsigned_long>
            ((char *)((long)local_70 - ((long)uVar14 >> 0x3f)),__len,uVar9);
  uVar13 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    uVar13 = local_90.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar13 < local_68 + local_90._M_string_length) {
    uVar14 = 0xf;
    if (local_70 != local_60) {
      uVar14 = local_60[0];
    }
    if (local_68 + local_90._M_string_length <= uVar14) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_70,0,(char *)0x0,(ulong)local_90._M_dataplus._M_p);
      goto LAB_006223a4;
    }
  }
  puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_70);
LAB_006223a4:
  local_b0 = &local_a0;
  puVar10 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar10) {
    local_a0 = *puVar10;
    uStack_98 = puVar6[3];
  }
  else {
    local_a0 = *puVar10;
    local_b0 = (undefined8 *)*puVar6;
  }
  *puVar6 = puVar10;
  puVar6[1] = 0;
  *(undefined1 *)puVar10 = 0;
  std::__cxx11::string::_M_append((char *)rankLog,(ulong)local_b0);
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  paVar1 = &local_90.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  uVar14 = this->m_nCalls;
  cVar11 = '\x01';
  if (9 < uVar14) {
    uVar9 = uVar14;
    cVar4 = '\x04';
    do {
      cVar11 = cVar4;
      if (uVar9 < 100) {
        cVar11 = cVar11 + -2;
        goto LAB_006224a4;
      }
      if (uVar9 < 1000) {
        cVar11 = cVar11 + -1;
        goto LAB_006224a4;
      }
      if (uVar9 < 10000) goto LAB_006224a4;
      bVar2 = 99999 < uVar9;
      uVar9 = uVar9 / 10000;
      cVar4 = cVar11 + '\x04';
    } while (bVar2);
    cVar11 = cVar11 + '\x01';
  }
LAB_006224a4:
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_90,cVar11);
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_90._M_dataplus._M_p,(uint)local_90._M_string_length,uVar14);
  puVar6 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,0x74cff4);
  puVar10 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar10) {
    local_a0 = *puVar10;
    uStack_98 = puVar6[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *puVar10;
    local_b0 = (undefined8 *)*puVar6;
  }
  *puVar6 = puVar10;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  std::__cxx11::string::_M_append((char *)rankLog,(ulong)local_b0);
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((this->m_nCalls < 500) && (2 < (this->m_Details)._M_string_length)) {
    std::operator+(&local_90,", \"trace\":[",&this->m_Details);
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
    puVar10 = puVar6 + 2;
    if ((undefined8 *)*puVar6 == puVar10) {
      local_a0 = *puVar10;
      uStack_98 = puVar6[3];
      puVar12 = &local_a0;
    }
    else {
      local_a0 = *puVar10;
      puVar12 = (undefined8 *)*puVar6;
    }
    *puVar6 = puVar10;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    std::__cxx11::string::_M_append((char *)rankLog,(ulong)puVar12);
    if (puVar12 != &local_a0) {
      operator_delete(puVar12);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p);
    }
  }
  std::__cxx11::string::append((char *)rankLog);
  return;
}

Assistant:

void AddToJsonStr(std::string &rankLog, const bool addComma = true) const
    {
        if (0 == m_nCalls)
            return;

        if (addComma)
        {
            rankLog += ", ";
        }
        rankLog += "\"" + m_Process + "\":{\"mus\":" + std::to_string(m_ProcessTime);
        rankLog += ", \"nCalls\":" + std::to_string(m_nCalls);

        if (500 > m_nCalls)
        {
            if (m_Details.size() > 2)
            {
                rankLog += ", \"trace\":[" + m_Details + "]";
            }
        }
        rankLog += "}";
    }